

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

int __thiscall CTcTokenizer::read_line_pp(CTcTokenizer *this)

{
  int iVar1;
  wchar_t wVar2;
  tc_toktyp_t tVar3;
  char *__s1;
  size_t __n;
  size_t sVar4;
  EVP_PKEY_CTX *dst;
  EVP_PKEY_CTX *src;
  CTcTokenizer *in_RDI;
  CTcTokenizer *unaff_retaddr;
  size_t p_ofs;
  size_t kwlen;
  char *kwtxt;
  pp_kw_def *kwp;
  int started_in_string;
  int ofs;
  CTcTokenizer *in_stack_ffffffffffffff90;
  CTcTokString *this_00;
  CTcTokString *in_stack_ffffffffffffff98;
  CTcTokenizer *in_stack_ffffffffffffffa0;
  code *pcVar5;
  CTcTokenizer *in_stack_ffffffffffffffa8;
  pp_kw_def *local_20;
  CTcTokenizer *pCVar6;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  pCVar6 = in_RDI;
  iVar1 = read_line((CTcTokenizer *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                    (int)((ulong)in_RDI >> 0x20));
  if (iVar1 == -1) {
    return 1;
  }
  wVar2 = in_RDI->in_quote_;
  start_new_line(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  while( true ) {
    utf8_ptr::getch((utf8_ptr *)0x28ff2e);
    iVar1 = is_space(L'\0');
    if (iVar1 == 0) break;
    utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffff90);
  }
  if (((wVar2 == L'\0') && (wVar2 = utf8_ptr::getch((utf8_ptr *)0x28ff69), wVar2 == L'#')) &&
     (in_RDI->allow_pp_ != 0)) {
    utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffff90);
    while (iVar1 = CTcTokStream::is_in_comment(in_RDI->str_), iVar1 != 0) {
      utf8_ptr::getptr(&in_RDI->p_);
      CTcTokString::get_buf(&in_RDI->linebuf_);
      iVar1 = read_line((CTcTokenizer *)
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        (int)((ulong)pCVar6 >> 0x20));
      if (iVar1 == -1) break;
      start_new_line(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    }
    next_on_line((CTcTokenizer *)0x29001c);
    tVar3 = CTcToken::gettyp(&in_RDI->curtok_);
    if (tVar3 == TOKT_EOF) {
      clear_linebuf(in_stack_ffffffffffffff90);
      return 0;
    }
    __s1 = CTcToken::get_text(&in_RDI->curtok_);
    __n = CTcToken::get_text_len(&in_RDI->curtok_);
    tVar3 = CTcToken::gettyp(&in_RDI->curtok_);
    if (tVar3 != TOKT_SYM) {
      log_error(0x2712,__n & 0xffffffff,__s1);
      clear_linebuf(in_stack_ffffffffffffff90);
      return 0;
    }
    for (local_20 = read_line_pp::kwlist; local_20->kw != (char *)0x0; local_20 = local_20 + 1) {
      sVar4 = strlen(local_20->kw);
      if ((sVar4 == __n) && (iVar1 = memcmp(__s1,local_20->kw,__n), iVar1 == 0)) {
        iVar1 = in_false_if(in_RDI);
        if ((iVar1 == 0) || (local_20->process_in_false_if != 0)) {
          pcVar5 = (code *)local_20->func;
          if (((ulong)pcVar5 & 1) != 0) {
            pcVar5 = *(code **)(pcVar5 + *(long *)(&in_RDI->field_0x0 +
                                                  *(long *)&local_20->field_0x18) + -1);
          }
          (*pcVar5)(&in_RDI->field_0x0 + *(long *)&local_20->field_0x18);
        }
        else {
          clear_linebuf(in_stack_ffffffffffffff90);
        }
        break;
      }
    }
    if (local_20->kw == (char *)0x0) {
      log_error(0x2712,__n & 0xffffffff,__s1);
    }
    in_RDI->in_quote_ = L'\0';
  }
  else {
    iVar1 = in_false_if(in_RDI);
    if (iVar1 == 0) {
      if (in_RDI->in_quote_ != L'\0') {
        splice_string(unaff_retaddr);
      }
      iVar1 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
      start_new_line(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,iVar1);
      expand_macros_curline
                (in_stack_ffffffffffffffa8,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                 (int)in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
    else {
      clear_linebuf(in_stack_ffffffffffffff90);
      iVar1 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
      CTcTokString::clear_text(&in_RDI->expbuf_);
    }
    if ((*(byte *)in_RDI >> 2 & 1) == 0) {
      start_new_line(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,iVar1);
    }
    else {
      this_00 = &in_RDI->linebuf_;
      dst = (EVP_PKEY_CTX *)CTcTokString::get_text(&in_RDI->expbuf_);
      src = (EVP_PKEY_CTX *)CTcTokString::get_text_len(&in_RDI->expbuf_);
      CTcTokString::copy(this_00,dst,src);
    }
  }
  return 0;
}

Assistant:

int CTcTokenizer::read_line_pp()
{
    /* 
     *   Read the next line from the input.  If that fails, return an end
     *   of file indication.  
     */
    int ofs = read_line(FALSE);
    if (ofs == -1)
        return 1;

    /* 
     *   before we process comments, note whether or not the line started
     *   out within a character string 
     */
    int started_in_string = (in_quote_ != '\0');
    
    /* set up our source pointer to the start of the new line */
    start_new_line(&linebuf_, ofs);

    /* skip leading whitespace */
    while (is_space(p_.getch()))
        p_.inc();
    
    /* 
     *   If this line begins with a '#', process the directive.  Ignore
     *   any initial '#' if the line started off in a string.  
     */
    if (!started_in_string && p_.getch() == '#' && allow_pp_)
    {
        struct pp_kw_def
        {
            const char *kw;
            int process_in_false_if;
            void (CTcTokenizer::*func)();
        };
        static pp_kw_def kwlist[] =
        {
            { "charset", FALSE, &CTcTokenizer::pp_charset },
            { "pragma",  FALSE, &CTcTokenizer::pp_pragma },
            { "include", FALSE, &CTcTokenizer::pp_include },
            { "define",  FALSE, &CTcTokenizer::pp_define },
            { "if",      TRUE,  &CTcTokenizer::pp_if },
            { "ifdef",   TRUE,  &CTcTokenizer::pp_ifdef },
            { "ifndef",  TRUE,  &CTcTokenizer::pp_ifndef },
            { "else",    TRUE,  &CTcTokenizer::pp_else },
            { "elif",    TRUE,  &CTcTokenizer::pp_elif },
            { "endif",   TRUE,  &CTcTokenizer::pp_endif },
            { "error",   FALSE, &CTcTokenizer::pp_error },
            { "undef",   FALSE, &CTcTokenizer::pp_undef },
            { "line",    FALSE, &CTcTokenizer::pp_line },
            { 0, 0, 0 }
        };
        pp_kw_def *kwp;
        const char *kwtxt;
        size_t kwlen;
        
        /* skip the '#' */
        p_.inc();
        
        /*
         *   If the line ended inside a comment, read the next line until
         *   we're no longer in a comment.  The ANSI C preprocessor rules
         *   say that a newline in a comment should not be treated as a
         *   lexical newline, so pretend that the next line is part of the
         *   preprocessor line in such a case. 
         */
        while (str_->is_in_comment())
        {
            size_t p_ofs;

            /* remember the current offset in the line buffer */
            p_ofs = p_.getptr() - linebuf_.get_buf();

            /* append another line - stop at the end of the stream */
            if (read_line(TRUE) == -1)
                break;

            /* restore the line pointer, in case the buffer moved */
            start_new_line(&linebuf_, p_ofs);
        }
        
        /* read the directive */
        next_on_line();

        /* 
         *   if we've reached the end of the line, it's a null directive;
         *   simply return an empty line 
         */
        if (curtok_.gettyp() == TOKT_EOF)
        {
            clear_linebuf();
            return 0;
        }

        /* get the text and length of the keyword */
        kwtxt = curtok_.get_text();
        kwlen = curtok_.get_text_len();

        /* if it's not a symbol, it's not a valid directive */
        if (curtok_.gettyp() != TOKT_SYM)
        {
            /* log the error and return an empty line */
            log_error(TCERR_INV_PP_DIR, (int)kwlen, kwtxt);
            clear_linebuf();
            return 0;
        }
        
        /* determine which keyword we have, and process it */
        for (kwp = kwlist ; kwp->kw != 0 ; ++kwp)
        {
            /* is this our keyword? */
            if (strlen(kwp->kw) == kwlen
                && memcmp(kwtxt, kwp->kw, kwlen) == 0)
            {
                /*
                 *   This is our directive.
                 *   
                 *   If we're in the false branch of a #if block, only
                 *   process the directive if it's a kind of directive
                 *   that we should process in false #if branches.  The
                 *   only directives that we process in #if branches are
                 *   those that would affect the #if branching, such as a
                 *   #endif or a nested #if.  
                 */
                if (!in_false_if() || kwp->process_in_false_if)
                {
                    /* invoke the handler to process the directive */
                    (this->*(kwp->func))();
                }
                else
                {
                    /* 
                     *   we're in a #if branch not taken - simply clear
                     *   the buffer 
                     */
                    clear_linebuf();
                }
                
                /* we don't need to look any further */
                break;
            }
        }

        /* 
         *   if we didn't find the keyword, log an error and otherwise
         *   ignore the entire line 
         */
        if (kwp->kw == 0)
            log_error(TCERR_INV_PP_DIR, (int)kwlen, kwtxt);
        
        /*
         *   Preprocessor lines must always be entirely self-contained.
         *   Therefore, it's not valid for a string to start on a
         *   preprocessor line and continue onto subsequent lines.  If
         *   we're marked as being inside a string, there must have been
         *   an error on the preprocessor line.  Simply clear the
         *   in-string flag; we don't need to issue an error at this
         *   point, since the preprocessor line handler should have
         *   already caught the problem and reported an error.  
         */
        in_quote_ = '\0';
    }
    else
    {
        /*
         *   There's no preprocessor directive.
         *   
         *   If we're in a false #if branch, return an empty line.  We
         *   return an empty line rather than skipping to the next line so
         *   that the caller sees the same number of lines as are in the
         *   original source.  
         */
        if (in_false_if())
        {
            /* 
             *   it's a #if not taken - we don't want to compile the line
             *   at all, so just clear it out 
             */
            clear_linebuf();
            expbuf_.clear_text();
        }
        else
        {
            /*
             *   If we ended the line in a string, splice additional lines
             *   onto the end of this line until we find the end of the
             *   string, then unsplice the part after the end of the
             *   string. 
             */
            if (in_quote_ != '\0')
            {
                /* splice additional lines to finish the quote */
                splice_string();
            }
            
            /*
             *   Expand macros in the line, splicing additional source
             *   lines if necessary to fill out any incomplete actual
             *   parameter lists.  
             */
            start_new_line(&linebuf_, 0);
            expand_macros_curline(TRUE, FALSE, FALSE);
        }

        /* store the line in the appropriate place */
        if (pp_only_mode_)
        {
            /* 
             *   we're only preprocessing - store the macro-expanded line
             *   back in the line buffer so that the caller can read out
             *   the final preprocessed text 
             */
            linebuf_.copy(expbuf_.get_text(), expbuf_.get_text_len());
        }
        else
        {
            /* 
             *   We're compiling - simply read subsequent tokens out of
             *   the expansion buffer.  
             */
            start_new_line(&expbuf_, 0);
        }
    }

    /* return success */
    return 0;
}